

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void __thiscall DBaseDecal::DBaseDecal(DBaseDecal *this,AActor *basis)

{
  double dVar1;
  
  DThinker::DThinker(&this->super_DThinker,1);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00705df0;
  this->WallNext = (DBaseDecal *)0x0;
  this->WallPrev = (DBaseDecal *)0x0;
  this->LeftDistance = 0.0;
  this->Z = (basis->__Pos).Z;
  dVar1 = (basis->Scale).Y;
  this->ScaleX = (basis->Scale).X;
  this->ScaleY = dVar1;
  this->Alpha = basis->Alpha;
  this->AlphaColor = basis->fillcolor;
  this->Translation = basis->Translation;
  (this->PicNum).texnum = (basis->picnum).texnum;
  this->RenderFlags = (basis->renderflags).Value;
  this->RenderStyle = basis->RenderStyle;
  this->Side = (side_t *)0x0;
  this->Sector = (sector_t_conflict *)0x0;
  return;
}

Assistant:

DBaseDecal::DBaseDecal (const AActor *basis)
: DThinker(STAT_DECAL),
	WallNext(nullptr), WallPrev(nullptr), LeftDistance(0), Z(basis->Z()), ScaleX(basis->Scale.X), ScaleY(basis->Scale.Y),
	Alpha(basis->Alpha), AlphaColor(basis->fillcolor), Translation(basis->Translation), PicNum(basis->picnum),
	RenderFlags(basis->renderflags), RenderStyle(basis->RenderStyle), Side(nullptr), Sector(nullptr)
{
}